

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_setuservalue(lua_State *L,int idx)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  int iVar3;
  TValue *pTVar4;
  StkId pTVar5;
  Udata *iu;
  TValue *io;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  iVar3 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar3 + 1;
  if (iVar3 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4ce,"void lua_setuservalue(lua_State *, int)");
  }
  if ((long)L->top - (long)L->ci->func >> 4 < 2) {
    __assert_fail("((1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4cf,"void lua_setuservalue(lua_State *, int)");
  }
  pTVar4 = index2addr(L,idx);
  if (pTVar4->tt_ != 0x8007) {
    __assert_fail("(((((o))->tt_) == (((7) | (1 << 15))))) && \"full userdata expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4d1,"void lua_setuservalue(lua_State *, int)");
  }
  pTVar1 = L->top;
  pTVar5 = pTVar1 + -1;
  if (pTVar4->tt_ != 0x8007) {
    __assert_fail("((((o))->tt_) == (((7) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4d2,"void lua_setuservalue(lua_State *, int)");
  }
  if (((pTVar4->value_).gc)->tt != '\a') {
    __assert_fail("(((o)->value_).gc)->tt == 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4d2,"void lua_setuservalue(lua_State *, int)");
  }
  p_Var2 = (pTVar4->value_).f;
  *(Value *)(p_Var2 + 0x20) = pTVar5->value_;
  *(LuaType *)(p_Var2 + 10) = pTVar1[-1].tt_;
  if ((pTVar1[-1].tt_ & 0x8000) != 0) {
    if ((pTVar1[-1].tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x4d2,"void lua_setuservalue(lua_State *, int)");
    }
    if ((pTVar1[-1].tt_ & 0x7f) != (ushort)((pTVar5->value_).gc)->tt) {
LAB_0011d33c:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x4d2,"void lua_setuservalue(lua_State *, int)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar1[-1].tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x4d2,"void lua_setuservalue(lua_State *, int)");
      }
      if ((((pTVar5->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0011d33c;
    }
  }
  if ((L->top[-1].tt_ & 0x8000) != 0) {
    if ((pTVar4->tt_ & 0x8000) == 0) {
      __assert_fail("(((o)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x4d3,"void lua_setuservalue(lua_State *, int)");
    }
    if ((((pTVar4->value_).gc)->marked & 0x20) != 0) {
      if ((L->top[-1].tt_ & 0x8000) == 0) {
        __assert_fail("(((L->top - 1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x4d3,"void lua_setuservalue(lua_State *, int)");
      }
      if (((L->top[-1].value_.gc)->marked & 0x18) != 0) {
        if ((pTVar4->tt_ & 0x8000) == 0) {
          __assert_fail("(((o)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x4d3,"void lua_setuservalue(lua_State *, int)");
        }
        if (9 < (((pTVar4->value_).gc)->tt & 0xf)) {
          __assert_fail("((((((void) sizeof (((((o)->tt_) & (1 << 15))) ? 1 : 0), __extension__ ({ if ((((o)->tt_) & (1 << 15))) ; else __assert_fail (\"(((o)->tt_) & (1 << 15))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c\", 1235, __extension__ __PRETTY_FUNCTION__); })), (((o)->value_).gc)))->tt) & 0x0F) < (9+1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x4d3,"void lua_setuservalue(lua_State *, int)");
        }
        if ((pTVar4->tt_ & 0x8000) == 0) {
          __assert_fail("(((o)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x4d3,"void lua_setuservalue(lua_State *, int)");
        }
        if ((L->top[-1].tt_ & 0x8000) == 0) {
          __assert_fail("(((L->top - 1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x4d3,"void lua_setuservalue(lua_State *, int)");
        }
        luaC_barrier_(L,(pTVar4->value_).gc,L->top[-1].value_.gc);
      }
    }
  }
  L->top = L->top + -1;
  iVar3 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar3;
  if (iVar3 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x4d5,"void lua_setuservalue(lua_State *, int)");
}

Assistant:

LUA_API void lua_setuservalue (lua_State *L, int idx) {
  StkId o;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2addr(L, idx);
  api_check(L, ttisfulluserdata(o), "full userdata expected");
  setuservalue(L, uvalue(o), L->top - 1);
  luaC_barrier(L, gcvalue(o), L->top - 1); /* Note this is different from Lua 5.4 where userdata is treated like a table */
  L->top--;
  lua_unlock(L);
}